

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsMan.c
# Opt level: O0

void Mfs_ManPrint(Mfs_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  double local_e0;
  double local_d0;
  double local_c0;
  double local_b0;
  double local_a0;
  double local_90;
  double local_80;
  double local_70;
  Mfs_Man_t *p_local;
  
  if (p->pPars->fResub == 0) {
    printf("Nodes = %d. Try = %d. Total mints = %d. Local DC mints = %d. Ratio = %5.2f.\n",
           ((double)(p->nMintsTotal - p->nMintsCare) * 1.0) / (double)p->nMintsTotal,
           (ulong)(uint)p->nTotalNodesBeg,(ulong)(uint)p->nNodesTried,(ulong)(uint)p->nMintsTotal,
           (ulong)(uint)(p->nMintsTotal - p->nMintsCare));
    printf("Nodes resyn = %d. Ratio = %5.2f.  Total AIG node gain = %d. Timeouts = %d.\n",
           ((double)p->nNodesDec * 1.0) / (double)p->nNodesTried,(ulong)(uint)p->nNodesDec,
           (ulong)(uint)p->nNodesGained,(ulong)(uint)p->nTimeOuts);
  }
  else {
    printf("Nodes = %d. Try = %d. Resub = %d. Div = %d. SAT calls = %d. Timeouts = %d. MaxDivs = %d.\n"
           ,(ulong)(uint)p->nTotalNodesBeg,(ulong)(uint)p->nNodesTried,(ulong)(uint)p->nNodesResub,
           (ulong)(uint)p->nTotalDivs,(ulong)(uint)p->nSatCalls,p->nTimeOuts,p->nMaxDivs);
    printf("Attempts :   ");
    uVar1 = p->nRemoves;
    uVar7 = p->nTryRemoves;
    iVar2 = p->nRemoves;
    iVar5 = Abc_MaxInt(1,p->nTryRemoves);
    printf("Remove %6d out of %6d (%6.2f %%)   ",((double)iVar2 * 100.0) / (double)iVar5,
           (ulong)uVar1,(ulong)uVar7);
    uVar1 = p->nResubs;
    uVar7 = p->nTryResubs;
    iVar2 = p->nResubs;
    iVar5 = Abc_MaxInt(1,p->nTryResubs);
    printf("Resub  %6d out of %6d (%6.2f %%)   ",((double)iVar2 * 100.0) / (double)iVar5,
           (ulong)uVar1,(ulong)uVar7);
    printf("\n");
    printf("Reduction:   ");
    iVar2 = p->nTotalNodesBeg;
    iVar5 = p->nTotalNodesEnd;
    uVar1 = p->nTotalNodesBeg;
    iVar3 = p->nTotalNodesBeg;
    iVar4 = p->nTotalNodesEnd;
    iVar6 = Abc_MaxInt(1,p->nTotalNodesBeg);
    printf("Nodes  %6d out of %6d (%6.2f %%)   ",((double)(iVar3 - iVar4) * 100.0) / (double)iVar6,
           (ulong)(uint)(iVar2 - iVar5),(ulong)uVar1);
    iVar2 = p->nTotalEdgesBeg;
    iVar5 = p->nTotalEdgesEnd;
    uVar1 = p->nTotalEdgesBeg;
    iVar3 = p->nTotalEdgesBeg;
    iVar4 = p->nTotalEdgesEnd;
    iVar6 = Abc_MaxInt(1,p->nTotalEdgesBeg);
    printf("Edges  %6d out of %6d (%6.2f %%)   ",((double)(iVar3 - iVar4) * 100.0) / (double)iVar6,
           (ulong)(uint)(iVar2 - iVar5),(ulong)uVar1);
    printf("\n");
    if (p->pPars->fPower != 0) {
      printf("Power( %5.2f, %4.2f%%) \n",(double)(p->TotalSwitchingBeg - p->TotalSwitchingEnd),
             ((double)(p->TotalSwitchingBeg - p->TotalSwitchingEnd) * 100.0) /
             (double)p->TotalSwitchingBeg);
    }
    if (p->pPars->fSwapEdge != 0) {
      uVar1 = p->nNodesResub;
      uVar7 = Abc_NtkGetTotalFanins(p->pNtk);
      iVar2 = p->nNodesResub;
      iVar5 = Abc_NtkGetTotalFanins(p->pNtk);
      printf("Swappable edges = %d. Total edges = %d. Ratio = %5.2f.\n",
             ((double)iVar2 * 1.0) / (double)iVar5,(ulong)uVar1,(ulong)uVar7);
    }
  }
  Abc_Print(1,"%s =","Win");
  if (p->timeTotal == 0) {
    local_70 = 0.0;
  }
  else {
    local_70 = ((double)p->timeWin * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeWin * 1.0) / 1000000.0,local_70);
  Abc_Print(1,"%s =","Div");
  if (p->timeTotal == 0) {
    local_80 = 0.0;
  }
  else {
    local_80 = ((double)p->timeDiv * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeDiv * 1.0) / 1000000.0,local_80);
  Abc_Print(1,"%s =","Aig");
  if (p->timeTotal == 0) {
    local_90 = 0.0;
  }
  else {
    local_90 = ((double)p->timeAig * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeAig * 1.0) / 1000000.0,local_90);
  Abc_Print(1,"%s =","Gia");
  if (p->timeTotal == 0) {
    local_a0 = 0.0;
  }
  else {
    local_a0 = ((double)p->timeGia * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeGia * 1.0) / 1000000.0,local_a0);
  Abc_Print(1,"%s =","Cnf");
  if (p->timeTotal == 0) {
    local_b0 = 0.0;
  }
  else {
    local_b0 = ((double)p->timeCnf * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeCnf * 1.0) / 1000000.0,local_b0);
  Abc_Print(1,"%s =","Sat");
  if (p->timeTotal == 0) {
    local_c0 = 0.0;
  }
  else {
    local_c0 = ((double)(p->timeSat - p->timeInt) * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)(p->timeSat - p->timeInt) * 1.0) / 1000000.0,
            local_c0);
  Abc_Print(1,"%s =","Int");
  if (p->timeTotal == 0) {
    local_d0 = 0.0;
  }
  else {
    local_d0 = ((double)p->timeInt * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeInt * 1.0) / 1000000.0,local_d0);
  Abc_Print(1,"%s =","ALL");
  if (p->timeTotal == 0) {
    local_e0 = 0.0;
  }
  else {
    local_e0 = ((double)p->timeTotal * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeTotal * 1.0) / 1000000.0,local_e0);
  return;
}

Assistant:

void Mfs_ManPrint( Mfs_Man_t * p )
{
    if ( p->pPars->fResub )
    {
        printf( "Nodes = %d. Try = %d. Resub = %d. Div = %d. SAT calls = %d. Timeouts = %d. MaxDivs = %d.\n",
            p->nTotalNodesBeg, p->nNodesTried, p->nNodesResub, p->nTotalDivs, p->nSatCalls, p->nTimeOuts, p->nMaxDivs );

        printf( "Attempts :   " );
        printf( "Remove %6d out of %6d (%6.2f %%)   ", p->nRemoves, p->nTryRemoves, 100.0*p->nRemoves/Abc_MaxInt(1, p->nTryRemoves) );
        printf( "Resub  %6d out of %6d (%6.2f %%)   ", p->nResubs,  p->nTryResubs,  100.0*p->nResubs /Abc_MaxInt(1, p->nTryResubs)  );
        printf( "\n" );

        printf( "Reduction:   " );
        printf( "Nodes  %6d out of %6d (%6.2f %%)   ", p->nTotalNodesBeg-p->nTotalNodesEnd, p->nTotalNodesBeg, 100.0*(p->nTotalNodesBeg-p->nTotalNodesEnd)/Abc_MaxInt(1, p->nTotalNodesBeg) );
        printf( "Edges  %6d out of %6d (%6.2f %%)   ", p->nTotalEdgesBeg-p->nTotalEdgesEnd, p->nTotalEdgesBeg, 100.0*(p->nTotalEdgesBeg-p->nTotalEdgesEnd)/Abc_MaxInt(1, p->nTotalEdgesBeg) );
        printf( "\n" );

        if (p->pPars->fPower)
            printf( "Power( %5.2f, %4.2f%%) \n",
                 p->TotalSwitchingBeg - p->TotalSwitchingEnd,
                 100.0*(p->TotalSwitchingBeg-p->TotalSwitchingEnd)/p->TotalSwitchingBeg );
        if ( p->pPars->fSwapEdge )
            printf( "Swappable edges = %d. Total edges = %d. Ratio = %5.2f.\n",
                p->nNodesResub, Abc_NtkGetTotalFanins(p->pNtk), 1.00 * p->nNodesResub / Abc_NtkGetTotalFanins(p->pNtk) );
//        printf( "Average ratio of DCs in the resubed nodes = %.2f.\n", 1.0*p->nDcMints/(64 * p->nNodesResub) );
    }
    else
    {
        printf( "Nodes = %d. Try = %d. Total mints = %d. Local DC mints = %d. Ratio = %5.2f.\n", 
            p->nTotalNodesBeg, p->nNodesTried, p->nMintsTotal, p->nMintsTotal-p->nMintsCare, 
            1.0 * (p->nMintsTotal-p->nMintsCare) / p->nMintsTotal );
//        printf( "Average ratio of sequential DCs in the global space = %5.2f.\n", 
//            1.0-(p->dTotalRatios/p->nNodesTried) );
        printf( "Nodes resyn = %d. Ratio = %5.2f.  Total AIG node gain = %d. Timeouts = %d.\n", 
            p->nNodesDec, 1.0 * p->nNodesDec / p->nNodesTried, p->nNodesGained, p->nTimeOuts );
    }

    ABC_PRTP( "Win", p->timeWin            ,  p->timeTotal );
    ABC_PRTP( "Div", p->timeDiv            ,  p->timeTotal );
    ABC_PRTP( "Aig", p->timeAig            ,  p->timeTotal );
    ABC_PRTP( "Gia", p->timeGia            ,  p->timeTotal );
    ABC_PRTP( "Cnf", p->timeCnf            ,  p->timeTotal );
    ABC_PRTP( "Sat", p->timeSat-p->timeInt ,  p->timeTotal );
    ABC_PRTP( "Int", p->timeInt            ,  p->timeTotal );
    ABC_PRTP( "ALL", p->timeTotal          ,  p->timeTotal );

}